

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O0

int arkRootCheck2(void *arkode_mem)

{
  undefined8 *puVar1;
  bool bVar2;
  sunrealtype in_RDI;
  double dVar3;
  ARKodeRootMem rootmem;
  ARKodeMem ark_mem;
  int zroot;
  sunrealtype tplus;
  sunrealtype smallh;
  int retval;
  int i;
  N_Vector local_48;
  N_Vector in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  sunrealtype t;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if (in_RDI == 0.0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x20d,"arkRootCheck2",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_root.c"
                    ,"arkode_mem = NULL illegal.");
    iVar4 = -0x15;
  }
  else {
    puVar1 = *(undefined8 **)((long)in_RDI + 0x3d8);
    if (*(int *)((long)puVar1 + 100) == 0) {
      iVar4 = 0;
    }
    else {
      t = in_RDI;
      ARKodeGetDky((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                   in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0);
      iVar4 = (*(code *)*puVar1)(puVar1[4],*(undefined8 *)((long)in_RDI + 0x248),puVar1[7],
                                 puVar1[0x10]);
      puVar1[0xd] = puVar1[0xd] + 1;
      if (iVar4 == 0) {
        bVar2 = false;
        for (iVar4 = 0; iVar4 < *(int *)(puVar1 + 1); iVar4 = iVar4 + 1) {
          *(undefined4 *)(puVar1[2] + (long)iVar4 * 4) = 0;
        }
        for (iVar4 = 0; iVar4 < *(int *)(puVar1 + 1); iVar4 = iVar4 + 1) {
          if (((*(int *)(puVar1[0xe] + (long)iVar4 * 4) != 0) &&
              (dVar3 = ABS(*(double *)(puVar1[7] + (long)iVar4 * 8)), dVar3 == 0.0)) &&
             (!NAN(dVar3))) {
            bVar2 = true;
            *(undefined4 *)(puVar1[2] + (long)iVar4 * 4) = 1;
          }
        }
        if (bVar2) {
          puVar1[0xb] = (ABS(*(double *)((long)in_RDI + 0x2f0)) +
                        ABS(*(double *)((long)in_RDI + 0x2c0))) * *(double *)((long)in_RDI + 8) *
                        100.0;
          if (*(double *)((long)in_RDI + 0x2c0) <= 0.0) {
            local_48 = (N_Vector)(puVar1[0xb] ^ 0x8000000000000000);
          }
          else {
            local_48 = (N_Vector)puVar1[0xb];
          }
          dVar3 = (double)puVar1[4];
          if (((dVar3 + (double)local_48) - *(double *)((long)in_RDI + 0x2f0)) *
              *(double *)((long)in_RDI + 0x2c0) < 0.0) {
            ARKodeGetDky((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),t,
                         iVar4,local_48);
          }
          else {
            N_VLinearSum(0x3ff0000000000000,local_48,*(undefined8 *)((long)in_RDI + 0x248),
                         *(undefined8 *)((long)in_RDI + 600),*(undefined8 *)((long)in_RDI + 0x248));
          }
          iVar4 = (*(code *)*puVar1)(dVar3 + (double)local_48,*(undefined8 *)((long)in_RDI + 0x248),
                                     puVar1[8],puVar1[0x10]);
          puVar1[0xd] = puVar1[0xd] + 1;
          if (iVar4 == 0) {
            bVar2 = false;
            for (iVar4 = 0; iVar4 < *(int *)(puVar1 + 1); iVar4 = iVar4 + 1) {
              if (*(int *)(puVar1[0xe] + (long)iVar4 * 4) != 0) {
                dVar3 = ABS(*(double *)(puVar1[8] + (long)iVar4 * 8));
                if ((dVar3 != 0.0) || (NAN(dVar3))) {
                  if (*(int *)(puVar1[2] + (long)iVar4 * 4) == 1) {
                    *(undefined8 *)(puVar1[7] + (long)iVar4 * 8) =
                         *(undefined8 *)(puVar1[8] + (long)iVar4 * 8);
                  }
                }
                else {
                  if (*(int *)(puVar1[2] + (long)iVar4 * 4) == 1) {
                    return 3;
                  }
                  bVar2 = true;
                  *(undefined4 *)(puVar1[2] + (long)iVar4 * 4) = 1;
                }
              }
            }
            if (bVar2) {
              iVar4 = 1;
            }
            else {
              iVar4 = 0;
            }
          }
          else {
            iVar4 = -0xc;
          }
        }
        else {
          iVar4 = 0;
        }
      }
      else {
        iVar4 = -0xc;
      }
    }
  }
  return iVar4;
}

Assistant:

int arkRootCheck2(void* arkode_mem)
{
  int i, retval;
  sunrealtype smallh, tplus;
  sunbooleantype zroot;
  ARKodeMem ark_mem;
  ARKodeRootMem rootmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;
  rootmem = ark_mem->root_mem;

  /* return if no roots in previous step */
  if (rootmem->irfnd == 0) { return (ARK_SUCCESS); }

  /* Set ark_ycur = y(tlo) */
  (void)ARKodeGetDky(ark_mem, rootmem->tlo, 0, ark_mem->ycur);

  /* Evaluate root-finding function: glo = g(tlo, y(tlo)) */
  retval = rootmem->gfun(rootmem->tlo, ark_mem->ycur, rootmem->glo,
                         rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* reset root-finding flags (overall, and for specific eqns) */
  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++) { rootmem->iroots[i] = 0; }

  /* for all active roots, check if glo_i == 0 to mark roots found */
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->glo[i]) == ZERO)
    {
      zroot              = SUNTRUE;
      rootmem->iroots[i] = 1;
    }
  }
  if (!zroot) { return (ARK_SUCCESS); /* return if no roots */ }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  /*     set time tolerance */
  rootmem->ttol = (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h)) *
                  ark_mem->uround * HUND;
  /*     set tplus = tlo + smallh */
  smallh = (ark_mem->h > ZERO) ? rootmem->ttol : -rootmem->ttol;
  tplus  = rootmem->tlo + smallh;
  /*     update ark_ycur with small explicit Euler step (if tplus is past tn) */
  if ((tplus - ark_mem->tcur) * ark_mem->h >= ZERO)
  {
    /* hratio = smallh/ark_mem->h; */
    N_VLinearSum(ONE, ark_mem->ycur, smallh, ark_mem->fn, ark_mem->ycur);
  }
  else
  {
    /*   set ark_ycur = y(tplus) via interpolation */
    (void)ARKodeGetDky(ark_mem, tplus, 0, ark_mem->ycur);
  }
  /*     set ghi = g(tplus,y(tplus)) */
  retval = rootmem->gfun(tplus, ark_mem->ycur, rootmem->ghi, rootmem->root_data);
  rootmem->nge++;
  if (retval != 0) { return (ARK_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < rootmem->nrtfn; i++)
  {
    if (!rootmem->gactive[i]) { continue; }
    if (SUNRabs(rootmem->ghi[i]) == ZERO)
    {
      if (rootmem->iroots[i] == 1) { return (CLOSERT); }
      zroot              = SUNTRUE;
      rootmem->iroots[i] = 1;
    }
    else
    {
      if (rootmem->iroots[i] == 1) { rootmem->glo[i] = rootmem->ghi[i]; }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (ARK_SUCCESS);
}